

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

void VW::dealloc_example(_func_void_void_ptr *delete_label,example *ec,
                        _func_void_void_ptr *delete_prediction)

{
  code *in_RDX;
  long in_RSI;
  code *in_RDI;
  size_t j;
  features *in_stack_ffffffffffffffe0;
  features *this;
  
  if (in_RDI != (code *)0x0) {
    (*in_RDI)(in_RSI + 0x6828);
  }
  if (in_RDX != (code *)0x0) {
    (*in_RDX)(in_RSI + 0x6850);
  }
  v_array<char>::delete_v((v_array<char> *)in_stack_ffffffffffffffe0);
  if (*(long *)(in_RSI + 0x68c0) != 0) {
    features::delete_v(in_stack_ffffffffffffffe0);
    if (*(void **)(in_RSI + 0x68c0) != (void *)0x0) {
      operator_delete(*(void **)(in_RSI + 0x68c0));
    }
  }
  for (this = (features *)0x0; this < (features *)0x100;
      this = (features *)((long)&(this->values)._begin + 1)) {
    features::delete_v(this);
  }
  v_array<unsigned_char>::delete_v((v_array<unsigned_char> *)this);
  return;
}

Assistant:

void dealloc_example(void (*delete_label)(void*), example& ec, void (*delete_prediction)(void*))
{
  if (delete_label)
    delete_label(&ec.l);

  if (delete_prediction)
    delete_prediction(&ec.pred);

  ec.tag.delete_v();

  if (ec.passthrough)
  {
    ec.passthrough->delete_v();
    delete ec.passthrough;
  }

  for (size_t j = 0; j < 256; j++) ec.feature_space[j].delete_v();

  ec.indices.delete_v();
}